

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_constraint.cpp
# Opt level: O1

string * __thiscall
duckdb::CheckConstraint::ToString_abi_cxx11_(string *__return_storage_ptr__,CheckConstraint *this)

{
  long lVar1;
  pointer pPVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->expression);
  (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(local_30);
  plVar3 = (long *)::std::__cxx11::string::replace((ulong)local_30,0,(char *)0x0,0x1e28a96);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
    local_50 = (long *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string CheckConstraint::ToString() const {
	return "CHECK(" + expression->ToString() + ")";
}